

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

spv_result_t
anon_unknown.dwarf_15f5114::spvTextToBinaryInternal
          (AssemblyGrammar *grammar,MessageConsumer *consumer,spv_text text,uint32_t options,
          spv_binary *pBinary)

{
  undefined1 auVar1 [16];
  bool bVar2;
  spv_result_t sVar3;
  spv_target_env env;
  uint32_t bound;
  DiagnosticStream *this;
  reference pInst;
  ulong uVar4;
  uint32_t *header;
  reference psVar5;
  uint *__src;
  size_type sVar6;
  undefined8 *__s;
  spv_binary binary;
  spv_result_t error_1;
  spv_instruction_t *inst_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *__range1_1;
  uint64_t currentIndex;
  uint32_t *data;
  spv_instruction_t *inst_1;
  iterator __end1;
  iterator __begin1;
  vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *__range1;
  size_t totalSize;
  spv_result_t error;
  spv_instruction_t *inst;
  uint32_t local_3d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_3d0;
  undefined1 local_3b8 [8];
  vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> instructions;
  undefined1 local_1c8 [8];
  AssemblyContext context;
  undefined1 local_68 [4];
  spv_result_t result;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> ids_to_preserve;
  spv_binary *pBinary_local;
  uint32_t options_local;
  spv_text text_local;
  MessageConsumer *consumer_local;
  AssemblyGrammar *grammar_local;
  
  ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pBinary;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_68);
  if (((options & 2) == 0) ||
     (context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           GetNumericIds(grammar,consumer,text,
                         (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_68),
     context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == SPV_SUCCESS)
     ) {
    spvtools::AssemblyContext::AssemblyContext
              ((AssemblyContext *)local_1c8,text,consumer,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_68
              );
    if (text->str == (char *)0x0) {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)
                 &instructions.
                  super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(AssemblyContext *)local_1c8);
      this = spvtools::DiagnosticStream::operator<<
                       ((DiagnosticStream *)
                        &instructions.
                         super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (char (*) [23])"Missing assembly text.");
      grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(this);
      spvtools::DiagnosticStream::~DiagnosticStream
                ((DiagnosticStream *)
                 &instructions.
                  super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    }
    else {
      bVar2 = spvtools::AssemblyGrammar::isValid(grammar);
      if (bVar2) {
        if (ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          grammar_local._4_4_ = SPV_ERROR_INVALID_POINTER;
          context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
        }
        else {
          std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::vector
                    ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)local_3b8);
          spvtools::AssemblyContext::advance((AssemblyContext *)local_1c8);
          do {
            bVar2 = spvtools::AssemblyContext::hasText((AssemblyContext *)local_1c8);
            if (!bVar2) break;
            inst._0_4_ = 0;
            inst._4_4_ = 0;
            local_3d8 = 0;
            memset(&vStack_3d0,0,0x18);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&vStack_3d0);
            std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::push_back
                      ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)local_3b8,
                       (value_type *)&inst);
            spv_instruction_t::~spv_instruction_t((spv_instruction_t *)&inst);
            pInst = std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::back
                              ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)
                               local_3b8);
            grammar_local._4_4_ = spvTextEncodeOpcode(grammar,(AssemblyContext *)local_1c8,pInst);
            if (grammar_local._4_4_ != SPV_SUCCESS) goto LAB_004c6efa;
            sVar3 = spvtools::AssemblyContext::advance((AssemblyContext *)local_1c8);
          } while (sVar3 == SPV_SUCCESS);
          __range1 = (vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)0x5;
          __end1 = std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::begin
                             ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)
                              local_3b8);
          inst_1 = (spv_instruction_t *)
                   std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::end
                             ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)
                              local_3b8);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<spv_instruction_t_*,_std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>_>
                                             *)&inst_1), bVar2) {
            psVar5 = __gnu_cxx::
                     __normal_iterator<spv_instruction_t_*,_std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>_>
                     ::operator*(&__end1);
            sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&psVar5->words);
            __range1 = (vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)
                       ((long)&(__range1->
                               super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>
                               )._M_impl.super__Vector_impl_data._M_start + sVar6);
            __gnu_cxx::
            __normal_iterator<spv_instruction_t_*,_std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>_>
            ::operator++(&__end1);
          }
          auVar1._8_8_ = 0;
          auVar1._0_8_ = __range1;
          uVar4 = SUB168(auVar1 * ZEXT816(4),0);
          if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
            uVar4 = 0xffffffffffffffff;
          }
          header = (uint32_t *)operator_new__(uVar4);
          if (header == (uint32_t *)0x0) {
            grammar_local._4_4_ = SPV_ERROR_OUT_OF_MEMORY;
          }
          else {
            __range1_1 = (vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)0x5;
            __end1_1 = std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::begin
                                 ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)
                                  local_3b8);
            inst_2 = (spv_instruction_t *)
                     std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::end
                               ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)
                                local_3b8);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end1_1,
                                      (__normal_iterator<spv_instruction_t_*,_std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>_>
                                       *)&inst_2), bVar2) {
              psVar5 = __gnu_cxx::
                       __normal_iterator<spv_instruction_t_*,_std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>_>
                       ::operator*(&__end1_1);
              __src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&psVar5->words)
              ;
              sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&psVar5->words)
              ;
              memcpy(header + (long)__range1_1,__src,sVar6 << 2);
              sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&psVar5->words)
              ;
              __range1_1 = (vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)
                           ((long)&(__range1_1->
                                   super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>
                                   )._M_impl.super__Vector_impl_data._M_start + sVar6);
              __gnu_cxx::
              __normal_iterator<spv_instruction_t_*,_std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>_>
              ::operator++(&__end1_1);
            }
            env = spvtools::AssemblyGrammar::target_env(grammar);
            bound = spvtools::AssemblyContext::getBound((AssemblyContext *)local_1c8);
            grammar_local._4_4_ = SetHeader(env,bound,header);
            if (grammar_local._4_4_ == SPV_SUCCESS) {
              __s = (undefined8 *)operator_new(0x10);
              memset(__s,0,0x10);
              if (__s == (undefined8 *)0x0) {
                if (header != (uint32_t *)0x0) {
                  operator_delete__(header);
                }
                grammar_local._4_4_ = SPV_ERROR_OUT_OF_MEMORY;
              }
              else {
                *__s = header;
                __s[1] = __range1;
                *(undefined8 **)ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     __s;
                grammar_local._4_4_ = SPV_SUCCESS;
              }
            }
          }
LAB_004c6efa:
          context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
          std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::~vector
                    ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)local_3b8);
        }
      }
      else {
        grammar_local._4_4_ = SPV_ERROR_INVALID_TABLE;
        context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
      }
    }
    spvtools::AssemblyContext::~AssemblyContext((AssemblyContext *)local_1c8);
  }
  else {
    context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    grammar_local._4_4_ =
         context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_68);
  return grammar_local._4_4_;
}

Assistant:

spv_result_t spvTextToBinaryInternal(const spvtools::AssemblyGrammar& grammar,
                                     const spvtools::MessageConsumer& consumer,
                                     const spv_text text,
                                     const uint32_t options,
                                     spv_binary* pBinary) {
  // The ids in this set will have the same values both in source and binary.
  // All other ids will be generated by filling in the gaps.
  std::set<uint32_t> ids_to_preserve;

  if (options & SPV_TEXT_TO_BINARY_OPTION_PRESERVE_NUMERIC_IDS) {
    // Collect all numeric ids from the source into ids_to_preserve.
    const spv_result_t result =
        GetNumericIds(grammar, consumer, text, &ids_to_preserve);
    if (result != SPV_SUCCESS) return result;
  }

  spvtools::AssemblyContext context(text, consumer, std::move(ids_to_preserve));

  if (!text->str) return context.diagnostic() << "Missing assembly text.";

  if (!grammar.isValid()) {
    return SPV_ERROR_INVALID_TABLE;
  }
  if (!pBinary) return SPV_ERROR_INVALID_POINTER;

  std::vector<spv_instruction_t> instructions;

  // Skip past whitespace and comments.
  context.advance();

  while (context.hasText()) {
    instructions.push_back({});
    spv_instruction_t& inst = instructions.back();

    if (auto error = spvTextEncodeOpcode(grammar, &context, &inst)) {
      return error;
    }

    if (context.advance()) break;
  }

  size_t totalSize = SPV_INDEX_INSTRUCTION;
  for (auto& inst : instructions) {
    totalSize += inst.words.size();
  }

  uint32_t* data = new uint32_t[totalSize];
  if (!data) return SPV_ERROR_OUT_OF_MEMORY;
  uint64_t currentIndex = SPV_INDEX_INSTRUCTION;
  for (auto& inst : instructions) {
    memcpy(data + currentIndex, inst.words.data(),
           sizeof(uint32_t) * inst.words.size());
    currentIndex += inst.words.size();
  }

  if (auto error = SetHeader(grammar.target_env(), context.getBound(), data))
    return error;

  spv_binary binary = new spv_binary_t();
  if (!binary) {
    delete[] data;
    return SPV_ERROR_OUT_OF_MEMORY;
  }
  binary->code = data;
  binary->wordCount = totalSize;

  *pBinary = binary;

  return SPV_SUCCESS;
}